

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O3

void __thiscall TcpServerImpl::SelectThread(TcpServerImpl *this)

{
  int iVar1;
  uint __fd;
  int *piVar2;
  uint *puVar3;
  TcpServerImpl *pTVar4;
  uint uVar5;
  long *plVar6;
  int *piVar7;
  uint *puVar8;
  int iVar9;
  int iVar10;
  atomic<unsigned_int> nNewConCbCount;
  socklen_t addLen;
  vector<int,_std::allocator<int>_> vSockets;
  int32_t fdClient;
  sockaddr_storage addrCl;
  int local_184;
  long local_180;
  vector<int,_std::allocator<int>_> local_178;
  int local_154;
  TcpServerImpl *local_150;
  timeval local_148;
  fd_set local_138;
  long *local_b0 [16];
  
  local_184 = 0;
  if ((this->super_BaseSocketImpl).m_bStop == false) {
    local_150 = this;
    do {
      local_148.tv_sec = 2;
      local_148.tv_usec = 0;
      local_138.fds_bits[0] = 0;
      local_138.fds_bits[1] = 0;
      local_138.fds_bits[2] = 0;
      local_138.fds_bits[3] = 0;
      local_138.fds_bits[4] = 0;
      local_138.fds_bits[5] = 0;
      local_138.fds_bits[6] = 0;
      local_138.fds_bits[7] = 0;
      local_138.fds_bits[8] = 0;
      local_138.fds_bits[9] = 0;
      local_138.fds_bits[10] = 0;
      local_138.fds_bits[0xb] = 0;
      local_138.fds_bits[0xc] = 0;
      local_138.fds_bits[0xd] = 0;
      local_138.fds_bits[0xe] = 0;
      local_138.fds_bits[0xf] = 0;
      piVar7 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar2 = (this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (piVar7 == piVar2) {
        iVar9 = 1;
      }
      else {
        iVar9 = 0;
        do {
          iVar1 = *piVar7;
          iVar10 = iVar1 + 0x3f;
          if (-1 < iVar1) {
            iVar10 = iVar1;
          }
          local_138.fds_bits[iVar10 >> 6] =
               local_138.fds_bits[iVar10 >> 6] | 1L << ((byte)iVar1 & 0x3f);
          if (iVar9 < iVar1) {
            iVar9 = iVar1;
          }
          piVar7 = piVar7 + 1;
        } while (piVar7 != piVar2);
        iVar9 = iVar9 + 1;
      }
      iVar9 = select(iVar9,&local_138,(fd_set *)0x0,(fd_set *)0x0,&local_148);
      if (0 < iVar9) {
        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (int *)0x0;
        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (int *)0x0;
        local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (int *)0x0;
        puVar8 = (uint *)(this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
        puVar3 = (uint *)(this->m_vSock).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
        this = local_150;
        if (puVar8 != puVar3) {
          do {
            __fd = *puVar8;
            uVar5 = __fd + 0x3f;
            if (-1 < (int)__fd) {
              uVar5 = __fd;
            }
            if (((ulong)local_138.fds_bits[(int)uVar5 >> 6] >> ((ulong)__fd & 0x3f) & 1) != 0) {
              iVar9 = 0x10;
              do {
                local_180 = CONCAT44(local_180._4_4_,0x80);
                local_154 = accept(__fd,(sockaddr *)local_b0,(socklen_t *)&local_180);
                if (local_154 == -1) break;
                if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish ==
                    local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)&local_178,
                             (iterator)
                             local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish,&local_154);
                }
                else {
                  *local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish = local_154;
                  local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish + 1;
                }
                iVar9 = iVar9 + -1;
              } while (iVar9 != 0);
            }
            pTVar4 = local_150;
            puVar8 = puVar8 + 1;
          } while (puVar8 != puVar3);
          if ((local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish !=
               local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start) &&
             ((local_150->super_BaseSocketImpl).m_bStop == false)) {
            LOCK();
            local_184 = local_184 + 1;
            UNLOCK();
            local_180 = 0;
            plVar6 = (long *)operator_new(0x30);
            *plVar6 = (long)&PTR___State_impl_00146818;
            std::vector<int,_std::allocator<int>_>::vector
                      ((vector<int,_std::allocator<int>_> *)(plVar6 + 1),&local_178);
            plVar6[4] = (long)pTVar4;
            plVar6[5] = (long)&local_184;
            local_b0[0] = plVar6;
            std::thread::_M_start_thread(&local_180,(sockaddr *)local_b0,0);
            if (local_b0[0] != (long *)0x0) {
              (**(code **)(*local_b0[0] + 8))();
            }
            std::thread::detach();
            if (local_180 != 0) {
              std::terminate();
            }
          }
          this = local_150;
          if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (int *)0x0) {
            operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
            this = local_150;
          }
        }
      }
    } while ((this->super_BaseSocketImpl).m_bStop == false);
  }
  if (local_184 != 0) {
    do {
      local_138.fds_bits[0] = 0;
      local_138.fds_bits[1] = 1000000;
      do {
        iVar9 = nanosleep((timespec *)&local_138,(timespec *)&local_138);
        if (iVar9 != -1) break;
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
    } while (local_184 != 0);
  }
  Delete(this);
  return;
}

Assistant:

void TcpServerImpl::SelectThread()
{
    atomic<uint32_t> nNewConCbCount(0);

    while (m_bStop == false)
    {
        fd_set readfd{};
        struct timeval timeout{};
        SOCKET maxFd = 0;

        timeout.tv_sec = 2;
        timeout.tv_usec = 0;
        FD_ZERO(&readfd);

        for (auto Sock : m_vSock)
        {
            FD_SET(Sock, &readfd);
            if (Sock > maxFd)
                maxFd = Sock;
        }

        const int iRes = ::select(static_cast<int>(maxFd + 1), &readfd, nullptr, nullptr, &timeout);
        if (iRes > 0)
        {
            vector<SOCKET> vSockets;

            for (auto Sock : m_vSock)
            {
                if (FD_ISSET(Sock, &readfd))
                {
                    for (int n = 0; n < 16; ++n)                // The ACCEPT_QUEUE is an optimization mechanism that allows the server to
                    {                                           // accept() up to this many connections before serving any of them.  The
                        struct sockaddr_storage addrCl;         // reason is that the timeout waiting for the accept() is much shorter
                        socklen_t addLen = sizeof(addrCl);      // than the timeout for the actual processing.

                        const SOCKET fdClient = ::accept(Sock, reinterpret_cast<struct sockaddr*>(&addrCl), &addLen);
                        if (fdClient == INVALID_SOCKET)
                            break;

                        vSockets.push_back(fdClient);
                    }
                }
            }

            if (vSockets.size() > 0 && m_bStop == false)
            {
                nNewConCbCount++;

                thread([this, &nNewConCbCount](const vector<SOCKET> vNewSockets)
                {
                    vector<TcpSocket*> vNewConnections;
                    for (const SOCKET sock : vNewSockets)
                    {
                        TcpSocket* pClient = MakeClientConnection(sock);
                        if (pClient == nullptr)
                            continue;
                        if (pClient->GetErrorNo() != 0)
                        {
                            if (m_fErrorParam)
                                m_fErrorParam(pClient, m_pvUserData);  // Must call Close() in the error callback
                            else if (m_fError)
                                m_fError(pClient);  // Must call Close() in the error callback
                            else
                                pClient->Close();
                            continue;
                        }
                        vNewConnections.push_back(pClient);
                    }
                    if (m_fNewConnectionParam != nullptr && m_bStop != true)
                        m_fNewConnectionParam(vNewConnections, m_pvUserData);
                    else if (m_fNewConnection != nullptr && m_bStop != true)
                        m_fNewConnection(vNewConnections);
                    else
                    {
                        for (auto pClient : vNewConnections)
                            pClient->Close();
                    }
                    nNewConCbCount--;
                }, vSockets).detach();
            }
        }
    }

    while (nNewConCbCount != 0)
        this_thread::sleep_for(chrono::milliseconds(1));

    Delete();
}